

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

void __thiscall ANN::set_batchSize(ANN *this,BatchSize batch_size)

{
  Shape SVar1;
  uint local_1c;
  Shape shape;
  BatchSize batch_size_local;
  ANN *this_local;
  
  if (this->m_dataSet == (DataSet *)0x0) {
    std::operator<<((ostream *)&std::cout,"ERROR [set_batchsize()]: No available dataset!\n");
  }
  SVar1 = DataSet::shape(this->m_dataSet);
  if (batch_size != None) {
    local_1c = SVar1.field_0._0_4_;
    if (batch_size == Half) {
      this->m_batchSize = local_1c >> 1;
    }
    else if (batch_size == Quarter) {
      this->m_batchSize = local_1c >> 2;
    }
  }
  return;
}

Assistant:

void ANN::set_batchSize(BatchSize batch_size){
    if(!m_dataSet){
        std::cout<<"ERROR [set_batchsize()]: No available dataset!\n";
    }
    
    Shape shape=m_dataSet->shape();
    switch (batch_size)
    {
    case None:
        ;
        break;
    case Half:
        m_batchSize=shape.n_row/2;
        break;
    case Quarter:
        m_batchSize=shape.n_row/4;
        break;
    default: break;
    }
}